

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int str_packsize(lua_State *L)

{
  KOption KVar1;
  ulong totalsize;
  long lVar2;
  int size;
  int ntoalign;
  char *fmt;
  Header h;
  int local_50;
  int local_4c;
  char *local_48;
  Header local_40;
  
  totalsize = 0;
  local_48 = luaL_checklstring(L,1,(size_t *)0x0);
  local_40.islittle = 1;
  local_40.maxalign = 1;
  local_40.L = L;
  if (*local_48 != '\0') {
    totalsize = 0;
    do {
      KVar1 = getdetails(&local_40,totalsize,&local_48,&local_50,&local_4c);
      if (0xfffffffd < KVar1 - Kpadding) {
        luaL_argerror(L,1,"variable-length format");
      }
      lVar2 = (long)local_50 + (long)local_4c;
      local_50 = (int)lVar2;
      if (0x7fffffffU - lVar2 < totalsize) {
        luaL_argerror(L,1,"format result too large");
      }
      totalsize = totalsize + lVar2;
    } while (*local_48 != '\0');
  }
  lua_pushinteger(L,totalsize);
  return 1;
}

Assistant:

static int str_packsize (lua_State *L) {
  Header h;
  const char *fmt = luaL_checkstring(L, 1);  /* format string */
  size_t totalsize = 0;  /* accumulate total size of result */
  initheader(L, &h);
  while (*fmt != '\0') {
    int size, ntoalign;
    KOption opt = getdetails(&h, totalsize, &fmt, &size, &ntoalign);
    luaL_argcheck(L, opt != Kstring && opt != Kzstr, 1,
                     "variable-length format");
    size += ntoalign;  /* total space used by option */
    luaL_argcheck(L, totalsize <= MAXSIZE - size, 1,
                     "format result too large");
    totalsize += size;
  }
  lua_pushinteger(L, (lua_Integer)totalsize);
  return 1;
}